

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O1

void __thiscall ON_LinetypeSegment::Dump(ON_LinetypeSegment *this,ON_TextLog *dump)

{
  char *format;
  
  if (this->m_seg_type == stLine) {
    format = "Segment type = Line: %g\n";
  }
  else {
    if (this->m_seg_type != stSpace) {
      return;
    }
    format = "Segment type = Space: %g\n";
  }
  ON_TextLog::Print(dump,format,this->m_length);
  return;
}

Assistant:

void ON_LinetypeSegment::Dump( ON_TextLog& dump) const
{
  switch( m_seg_type)
  {
  case ON_LinetypeSegment::eSegType::stLine:
    dump.Print( "Segment type = Line: %g\n", m_length);
    break;
  case ON_LinetypeSegment::eSegType::stSpace:
    dump.Print( "Segment type = Space: %g\n", m_length);
    break;
  case ON_LinetypeSegment::eSegType::Unset:
    break;
  }
}